

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_delete_selection(ImGuiTextEditState *str,STB_TexteditState *state)

{
  STB_TexteditState *state_local;
  ImGuiTextEditState *str_local;
  
  stb_textedit_clamp(str,state);
  if (state->select_start != state->select_end) {
    if (state->select_start < state->select_end) {
      stb_textedit_delete(str,state,state->select_start,state->select_end - state->select_start);
      state->cursor = state->select_start;
      state->select_end = state->select_start;
    }
    else {
      stb_textedit_delete(str,state,state->select_end,state->select_start - state->select_end);
      state->cursor = state->select_end;
      state->select_start = state->select_end;
    }
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

static void stb_textedit_delete_selection(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   stb_textedit_clamp(str, state);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start < state->select_end) {
         stb_textedit_delete(str, state, state->select_start, state->select_end - state->select_start);
         state->select_end = state->cursor = state->select_start;
      } else {
         stb_textedit_delete(str, state, state->select_end, state->select_start - state->select_end);
         state->select_start = state->cursor = state->select_end;
      }
      state->has_preferred_x = 0;
   }
}